

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O0

uint32_t mpack_node_data_len(mpack_node_t node)

{
  mpack_type_t mVar1;
  mpack_error_t mVar2;
  mpack_type_t type;
  mpack_node_t node_local;
  
  mVar2 = mpack_node_error(node);
  if (mVar2 == mpack_ok) {
    mVar1 = (node.data)->type;
    if (((mVar1 == mpack_type_str) || (mVar1 == mpack_type_bin)) || (mVar1 == mpack_type_ext)) {
      node_local.tree._4_4_ = (node.data)->len;
    }
    else {
      mpack_node_flag_error(node,mpack_error_type);
      node_local.tree._4_4_ = 0;
    }
  }
  else {
    node_local.tree._4_4_ = 0;
  }
  return node_local.tree._4_4_;
}

Assistant:

MPACK_INLINE uint32_t mpack_node_data_len(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    mpack_type_t type = node.data->type;
    if (type == mpack_type_str || type == mpack_type_bin || type == mpack_type_ext)
        return (uint32_t)node.data->len;

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}